

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option-parser.cc
# Opt level: O0

void __thiscall wabt::OptionParser::Errorf(OptionParser *this,char *format,...)

{
  long lVar1;
  function<void_(const_char_*)> *this_00;
  string *psVar2;
  OptionParser *pOVar3;
  char in_AL;
  int iVar4;
  long lVar5;
  char *__args;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *__s;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined8 uStack_1e0;
  char acStack_1d8 [8];
  function<void_(const_char_*)> *local_1d0;
  string *local_1c8;
  OptionParser *local_1c0;
  undefined1 local_1b8 [16];
  undefined8 local_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  undefined8 local_190;
  undefined4 local_188;
  undefined8 local_178;
  undefined8 local_168;
  undefined8 local_158;
  undefined8 local_148;
  undefined8 local_138;
  undefined8 local_128;
  undefined8 local_118;
  string local_108 [8];
  string msg;
  size_t length;
  char *buffer;
  char fixed_buf [128];
  va_list args_copy;
  undefined4 uStack_38;
  undefined4 uStack_34;
  va_list args;
  char *format_local;
  OptionParser *this_local;
  
  __s = acStack_1d8;
  if (in_AL != '\0') {
    local_188 = in_XMM0_Da;
    local_178 = in_XMM1_Qa;
    local_168 = in_XMM2_Qa;
    local_158 = in_XMM3_Qa;
    local_148 = in_XMM4_Qa;
    local_138 = in_XMM5_Qa;
    local_128 = in_XMM6_Qa;
    local_118 = in_XMM7_Qa;
  }
  args[0].overflow_arg_area = local_1b8;
  args[0]._0_8_ = &stack0x00000008;
  uStack_34 = 0x30;
  uStack_38 = 0x10;
  fixed_buf[0x78] = '\x10';
  fixed_buf[0x79] = '\0';
  fixed_buf[0x7a] = '\0';
  fixed_buf[0x7b] = '\0';
  fixed_buf[0x7c] = '0';
  fixed_buf[0x7d] = '\0';
  fixed_buf[0x7e] = '\0';
  fixed_buf[0x7f] = '\0';
  uStack_1e0 = 0x192527;
  local_1c0 = this;
  local_1a8 = in_RDX;
  local_1a0 = in_RCX;
  local_198 = in_R8;
  local_190 = in_R9;
  iVar4 = vsnprintf((char *)&buffer,0x80,format,&uStack_38);
  lVar5 = (long)iVar4;
  length = (size_t)&buffer;
  if (0x80 < lVar5 + 1U) {
    lVar1 = -(lVar5 + 0x10U & 0xfffffffffffffff0);
    __s = acStack_1d8 + lVar1;
    *(undefined8 *)((long)&uStack_1e0 + lVar1) = 0x192585;
    vsnprintf(__s,lVar5 + 1,format,fixed_buf + 0x78);
    length = (size_t)__s;
  }
  pOVar3 = local_1c0;
  local_1c8 = local_108;
  __s[-8] = -0x58;
  __s[-7] = '%';
  __s[-6] = '\x19';
  __s[-5] = '\0';
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  std::__cxx11::string::string(local_108,(string *)pOVar3);
  psVar2 = local_1c8;
  __s[-8] = -0x45;
  __s[-7] = '%';
  __s[-6] = '\x19';
  __s[-5] = '\0';
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  std::__cxx11::string::operator+=(psVar2,": ");
  psVar2 = local_1c8;
  __s[-8] = -0x32;
  __s[-7] = '%';
  __s[-6] = '\x19';
  __s[-5] = '\0';
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  std::__cxx11::string::operator+=(psVar2,(char *)length);
  psVar2 = local_1c8;
  __s[-8] = -0x1f;
  __s[-7] = '%';
  __s[-6] = '\x19';
  __s[-5] = '\0';
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  std::__cxx11::string::operator+=(psVar2,"\nTry \'--help\' for more information.");
  local_1d0 = &local_1c0->on_error_;
  __s[-8] = -1;
  __s[-7] = '%';
  __s[-6] = '\x19';
  __s[-5] = '\0';
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  __args = (char *)std::__cxx11::string::c_str();
  this_00 = local_1d0;
  builtin_strncpy(__s + -8,"\x0e&\x19",4);
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  std::function<void_(const_char_*)>::operator()(this_00,__args);
  psVar2 = local_1c8;
  builtin_strncpy(__s + -8,"\x1a&\x19",4);
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  std::__cxx11::string::~string(psVar2);
  return;
}

Assistant:

void OptionParser::Errorf(const char* format, ...) {
  WABT_SNPRINTF_ALLOCA(buffer, length, format);
  std::string msg(program_name_);
  msg += ": ";
  msg += buffer;
  msg += "\nTry '--help' for more information.";
  on_error_(msg.c_str());
}